

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitBitVector.h
# Opt level: O3

bool __thiscall BVUnitT<unsigned_long>::Dump(BVUnitT<unsigned_long> *this,BVIndex base,bool hasBits)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  
  uVar3 = this->word;
  if (uVar3 != 0) {
    uVar1 = 0;
    bVar2 = hasBits;
    if (uVar3 != 0) {
      for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    do {
      AssertRange((BVIndex)uVar1);
      if ((bVar2 & 1) != 0) {
        Output::Print(L", ");
      }
      uVar3 = uVar3 & ~(1L << (uVar1 & 0x3f));
      Output::Print(L"%u",(ulong)((BVIndex)uVar1 + base));
      uVar1 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      hasBits = true;
      bVar2 = 1;
    } while (uVar3 != 0);
  }
  return hasBits;
}

Assistant:

bool Dump(BVIndex base = 0, bool hasBits = false) const
    {
        FOREACH_BITSET_IN_UNITBV(index, *this, BVUnitT)
        {
            if (hasBits)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%u"), index + base);
            hasBits = true;
        }
        NEXT_BITSET_IN_UNITBV;
        return hasBits;
    }